

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

void __thiscall
icu_63::NoopNormalizer2::normalizeUTF8
          (NoopNormalizer2 *this,uint32_t options,StringPiece src,ByteSink *sink,Edits *edits,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t unchangedLength;
  uint uVar2;
  char *pcVar3;
  Edits *edits_local;
  ByteSink *sink_local;
  uint32_t options_local;
  NoopNormalizer2 *this_local;
  StringPiece src_local;
  
  this_local = (NoopNormalizer2 *)src.ptr_;
  src_local.ptr_._0_4_ = src.length_;
  UVar1 = ::U_SUCCESS(*errorCode);
  if (UVar1 != '\0') {
    if (edits != (Edits *)0x0) {
      if ((options & 0x2000) == 0) {
        Edits::reset(edits);
      }
      unchangedLength = StringPiece::length((StringPiece *)&this_local);
      Edits::addUnchanged(edits,unchangedLength);
    }
    if ((options & 0x4000) == 0) {
      pcVar3 = StringPiece::data((StringPiece *)&this_local);
      uVar2 = StringPiece::length((StringPiece *)&this_local);
      (*sink->_vptr_ByteSink[2])(sink,pcVar3,(ulong)uVar2);
    }
    (*sink->_vptr_ByteSink[4])();
  }
  return;
}

Assistant:

virtual void
    normalizeUTF8(uint32_t options, StringPiece src, ByteSink &sink,
                  Edits *edits, UErrorCode &errorCode) const U_OVERRIDE {
        if(U_SUCCESS(errorCode)) {
            if (edits != nullptr) {
                if ((options & U_EDITS_NO_RESET) == 0) {
                    edits->reset();
                }
                edits->addUnchanged(src.length());
            }
            if ((options & U_OMIT_UNCHANGED_TEXT) == 0) {
                sink.Append(src.data(), src.length());
            }
            sink.Flush();
        }
    }